

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

int xmlTextWriterWriteRawLen(xmlTextWriterPtr writer,xmlChar *content,int len)

{
  int iVar1;
  int iVar2;
  xmlLinkPtr lk;
  xmlTextWriterStackEntry *p;
  
  if (writer == (xmlTextWriterPtr)0x0) {
    xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                  (xmlNode *)0x0,0x19,1,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                  (char *)0x0,0,0,"%s","xmlTextWriterWriteRawLen : invalid writer!\n");
  }
  else {
    if (content != (xmlChar *)0x0 && -1 < len) {
      lk = xmlListFront(writer->nodes);
      if (lk == (xmlLinkPtr)0x0) {
        iVar1 = 0;
      }
      else {
        p = (xmlTextWriterStackEntry *)xmlLinkGetData(lk);
        iVar1 = xmlTextWriterHandleStateDependencies(writer,p);
        if (iVar1 < 0) {
          return -1;
        }
      }
      if (writer->indent != 0) {
        writer->doindent = 0;
      }
      iVar2 = xmlOutputBufferWrite(writer->out,len,(char *)content);
      if (-1 < iVar2) {
        return iVar1 + iVar2;
      }
      return -1;
    }
    xmlWriterErrMsg(writer,XML_ERR_INTERNAL_ERROR,"xmlTextWriterWriteRawLen : invalid content!\n");
  }
  return -1;
}

Assistant:

int
xmlTextWriterWriteRawLen(xmlTextWriterPtr writer, const xmlChar * content,
                         int len)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterWriteRawLen : invalid writer!\n");
        return -1;
    }

    if ((content == NULL) || (len < 0)) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterWriteRawLen : invalid content!\n");
        return -1;
    }

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk != 0) {
        p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
        count = xmlTextWriterHandleStateDependencies(writer, p);
        if (count < 0)
            return -1;
        sum += count;
    }

    if (writer->indent)
        writer->doindent = 0;

    if (content != NULL) {
        count =
            xmlOutputBufferWrite(writer->out, len, (const char *) content);
        if (count < 0)
            return -1;
        sum += count;
    }

    return sum;
}